

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePolicyCommand.cxx
# Opt level: O2

bool __thiscall
cmCMakePolicyCommand::InitialPass
          (cmCMakePolicyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar1;
  ostream *poVar2;
  ostringstream e;
  string sStack_1b8;
  undefined1 local_198 [32];
  _WordT local_178;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (__lhs == (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_198,"requires at least one argument.",(allocator<char> *)&sStack_1b8)
    ;
    cmCommand::SetError(&this->super_cmCommand,(string *)local_198);
  }
  else {
    bVar1 = std::operator==(__lhs,"SET");
    if (bVar1) {
      bVar1 = HandleSetMode(this,args);
      return bVar1;
    }
    bVar1 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start,"GET");
    if (bVar1) {
      bVar1 = HandleGetMode(this,args);
      return bVar1;
    }
    bVar1 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start,"PUSH");
    if (bVar1) {
      if ((ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
        local_198._16_8_ = 0;
        local_198._24_8_ = 0;
        local_198._0_8_ = (pointer)0x0;
        local_198._8_8_ = 0;
        local_178 = 0;
        cmMakefile::PushPolicy((this->super_cmCommand).Makefile,false,(PolicyMap *)local_198);
        return true;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_198,"PUSH may not be given additional arguments.",
                 (allocator<char> *)&sStack_1b8);
      cmCommand::SetError(&this->super_cmCommand,(string *)local_198);
    }
    else {
      bVar1 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start,"POP");
      if (!bVar1) {
        bVar1 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start,"VERSION");
        if (bVar1) {
          bVar1 = HandleVersionMode(this,args);
          return bVar1;
        }
        bVar1 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start,"GET_WARNING");
        if (!bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
          poVar2 = std::operator<<((ostream *)local_198,"given unknown first argument \"");
          poVar2 = std::operator<<(poVar2,(string *)
                                          (args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start);
          std::operator<<(poVar2,"\"");
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&sStack_1b8);
          std::__cxx11::string::~string((string *)&sStack_1b8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
          return false;
        }
        bVar1 = HandleGetWarningMode(this,args);
        return bVar1;
      }
      if ((ulong)((long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
        cmMakefile::PopPolicy((this->super_cmCommand).Makefile);
        return true;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_198,"POP may not be given additional arguments.",
                 (allocator<char> *)&sStack_1b8);
      cmCommand::SetError(&this->super_cmCommand,(string *)local_198);
    }
  }
  std::__cxx11::string::~string((string *)local_198);
  return false;
}

Assistant:

bool cmCMakePolicyCommand::InitialPass(std::vector<std::string> const& args,
                                       cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("requires at least one argument.");
    return false;
  }

  if (args[0] == "SET") {
    return this->HandleSetMode(args);
  }
  if (args[0] == "GET") {
    return this->HandleGetMode(args);
  }
  if (args[0] == "PUSH") {
    if (args.size() > 1) {
      this->SetError("PUSH may not be given additional arguments.");
      return false;
    }
    this->Makefile->PushPolicy();
    return true;
  }
  if (args[0] == "POP") {
    if (args.size() > 1) {
      this->SetError("POP may not be given additional arguments.");
      return false;
    }
    this->Makefile->PopPolicy();
    return true;
  }
  if (args[0] == "VERSION") {
    return this->HandleVersionMode(args);
  }
  if (args[0] == "GET_WARNING") {
    return this->HandleGetWarningMode(args);
  }

  std::ostringstream e;
  e << "given unknown first argument \"" << args[0] << "\"";
  this->SetError(e.str());
  return false;
}